

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getOutputMatrix(FastText *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<const_fasttext::DenseMatrix> sVar3;
  shared_ptr<fasttext::Matrix> local_28;
  
  if (((char)in_RSI[0xd] == '\x01') && (*(char *)(*in_RSI + 0xd1) == '\x01')) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_RSI[6] != 0) {
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>(&local_28);
    _Var2._M_pi = local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peVar1;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_fasttext::DenseMatrix>)
           sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("output_.get()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/fasttext.cc"
                ,0x4c,
                "std::shared_ptr<const DenseMatrix> fasttext::FastText::getOutputMatrix() const");
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getOutputMatrix() const {
  if (quant_ && args_->qout) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(output_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(output_);
}